

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsHessian_ASA_FSA.c
# Opt level: O3

int fQ(sunrealtype t,N_Vector y,N_Vector qdot,void *user_data)

{
  double *pdVar1;
  
  pdVar1 = *(double **)((long)y->content + 0x10);
  **(double **)((long)qdot->content + 0x10) =
       (pdVar1[2] * pdVar1[2] + *pdVar1 * *pdVar1 + pdVar1[1] * pdVar1[1]) * 0.5;
  return 0;
}

Assistant:

static int fQ(sunrealtype t, N_Vector y, N_Vector qdot, void* user_data)
{
  sunrealtype y1, y2, y3;

  y1 = Ith(y, 1);
  y2 = Ith(y, 2);
  y3 = Ith(y, 3);

  Ith(qdot, 1) = 0.5 * (y1 * y1 + y2 * y2 + y3 * y3);

  return (0);
}